

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O2

_Bool check_hw_breakpoints(CPUX86State *env,_Bool force_dr6_update)

{
  long lVar1;
  _Bool _Var2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = env->dr[6] & 0xfffffffffffffff0;
  bVar3 = 0x10;
  lVar4 = 0;
  uVar6 = 0;
  _Var2 = false;
  do {
    if (lVar4 == 8) {
      if (force_dr6_update || _Var2 != false) {
        env->dr[6] = uVar5;
      }
      return _Var2;
    }
    switch((uint)(env->dr[7] >> (bVar3 & 0x3f)) & 3) {
    case 0:
      if (*(target_ulong *)((long)env->dr + lVar4 * 4) == env->eip) {
LAB_004c563e:
        uVar5 = uVar5 | 1L << (uVar6 & 0x3f);
        _Var2 = (_Bool)(_Var2 | (env->dr[7] &
                                (1L << ((byte)lVar4 & 0x3f) | 2L << ((byte)lVar4 & 0x3f))) != 0);
      }
      break;
    default:
      lVar1 = *(long *)((long)env->dr + lVar4 * 4 + 0x40);
      if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x1c) & 0xc0) != 0)) goto LAB_004c563e;
      break;
    case 2:
      break;
    }
    uVar6 = uVar6 + 1;
    lVar4 = lVar4 + 2;
    bVar3 = bVar3 + 4;
  } while( true );
}

Assistant:

static bool check_hw_breakpoints(CPUX86State *env, bool force_dr6_update)
{
    target_ulong dr6;
    int reg;
    bool hit_enabled = false;

    dr6 = env->dr[6] & ~0xf;
    for (reg = 0; reg < DR7_MAX_BP; reg++) {
        bool bp_match = false;
        bool wp_match = false;

        switch (hw_breakpoint_type(env->dr[7], reg)) {
        case DR7_TYPE_BP_INST:
            if (env->dr[reg] == env->eip) {
                bp_match = true;
            }
            break;
        case DR7_TYPE_DATA_WR:
        case DR7_TYPE_DATA_RW:
            if (env->cpu_watchpoint[reg] &&
                env->cpu_watchpoint[reg]->flags & BP_WATCHPOINT_HIT) {
                wp_match = true;
            }
            break;
        case DR7_TYPE_IO_RW:
            break;
        }
        if (bp_match || wp_match) {
            dr6 |= 1ULL << reg;
            if (hw_breakpoint_enabled(env->dr[7], reg)) {
                hit_enabled = true;
            }
        }
    }

    if (hit_enabled || force_dr6_update) {
        env->dr[6] = dr6;
    }

    return hit_enabled;
}